

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::MLsyncProject
          (Projection *this,int c_lev,MultiFab *pres_crse,MultiFab *vel_crse,MultiFab *cc_rhs_crse,
          MultiFab *pres_fine,MultiFab *vel_fine,MultiFab *cc_rhs_fine,MultiFab *rho_crse,
          MultiFab *rho_fine,MultiFab *Vsync,MultiFab *V_corr,MultiFab *phi_fine,
          SyncRegister *rhs_sync_reg,SyncRegister *crsr_sync_reg,Real dt_crse,IntVect *ratio,
          int crse_iteration,int crse_dt_ratio,Geometry *crse_geom)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  BoxArray *bxs_00;
  int *piVar1;
  ostringstream *poVar2;
  ulong uVar3;
  MultiFab *pMVar4;
  pointer pGVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int i;
  int level;
  int iVar8;
  pointer puVar9;
  MultiFab *pMVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  undefined1 (*pauVar15) [16];
  NavierStokesBase *this_00;
  FabArray<amrex::FArrayBox> *pFVar16;
  ostream *poVar17;
  byte bVar18;
  uint uVar19;
  Geometry *crse_geom_00;
  byte bVar20;
  undefined4 uVar21;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  long lVar22;
  long lVar23;
  double dVar24;
  int iVar26;
  double dVar25;
  undefined1 auVar27 [16];
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  phi;
  Box bx;
  FabFactory<amrex::FArrayBox> local_3a0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_398;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_380;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_368;
  undefined1 (*local_350) [16];
  undefined1 (*local_348) [16];
  undefined1 (*local_340) [16];
  BoxArray sync_boxes;
  MultiFab rhnd;
  IntVect *vel;
  
  if (verbose != 0) {
    sync_boxes.m_bat.m_op._4_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1);
    sync_boxes.m_bat.m_op.m_indexType.m_typ.itype =
         (BATindexType)(BATindexType)*(undefined4 *)(DAT_00816950 + -0x48);
    sync_boxes.m_bat.m_bat_type = *(BATType *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)
     ((long)&sync_boxes.m_bat.m_op + *(long *)(sync_boxes.m_bat.m_op._12_8_ + -0x18) + 0x14) =
         *(undefined8 *)
          (sync_boxes.m_bat.m_op._4_8_ + 8 + *(long *)(*(long *)sync_boxes.m_bat.m_op._4_8_ + -0x18)
          );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Projection::MLsyncProject(): levels = ",0x26);
    std::ostream::operator<<(poVar2,c_lev);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
    std::ostream::operator<<(poVar2,c_lev + 1);
    rhnd.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,(char *)&rhnd,1);
    amrex::Print::~Print((Print *)&sync_boxes);
    if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
      amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    }
  }
  dVar24 = amrex::ParallelDescriptor::second();
  phi.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  phi.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  phi.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar9 = (pointer)operator_new(0x50);
  phi.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar9 + 10;
  *(undefined1 (*) [16])(puVar9 + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(puVar9 + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(puVar9 + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(puVar9 + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])puVar9 = (undefined1  [16])0x0;
  phi.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       phi.
       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  phi.
  super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar9;
  pMVar10 = (MultiFab *)operator_new(0x180);
  bxs = &(pres_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(pres_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  lVar22 = (long)c_lev;
  sync_boxes.m_bat._0_8_ = 1;
  sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
  sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (pMVar10,bxs,dm,1,1,(MFInfo *)&sync_boxes,
             (FabFactory<amrex::FArrayBox> *)
             ((this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22]->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            );
  pMVar4 = puVar9[lVar22]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  puVar9[lVar22]._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar10;
  if (pMVar4 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
  pFVar16 = &(phi.
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
             super_FabArray<amrex::FArrayBox>;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (pFVar16,0.0,0,(pFVar16->super_FabArrayBase).n_comp,
             &(pFVar16->super_FabArrayBase).n_grow);
  puVar9 = phi.
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar10 = (MultiFab *)operator_new(0x180);
  bxs_00 = &(pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  level = c_lev + 1;
  lVar23 = (long)level;
  sync_boxes.m_bat._0_8_ = 1;
  sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
  sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (pMVar10,bxs_00,
             &(pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,1,
             (MFInfo *)&sync_boxes,
             (FabFactory<amrex::FArrayBox> *)
             ((this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar23]->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            );
  pMVar4 = puVar9[lVar23]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  puVar9[lVar23]._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar10;
  if (pMVar4 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
  pFVar16 = &(phi.
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
             super_FabArray<amrex::FArrayBox>;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (pFVar16,0.0,0,(pFVar16->super_FabArrayBase).n_comp,
             &(pFVar16->super_FabArrayBase).n_grow);
  sync_boxes.m_bat._0_8_ = 1;
  sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
  sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (&rhnd,bxs,dm,1,0,(MFInfo *)&sync_boxes,
             (FabFactory<amrex::FArrayBox> *)
             ((this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22]->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
  SyncRegister::InitRHS(rhs_sync_reg,&rhnd,crse_geom,this->phys_bc);
  uVar6 = *(undefined8 *)(crse_geom->domain).smallend.vect;
  uVar7 = *(undefined8 *)((crse_geom->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(crse_geom->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((crse_geom->domain).bigend.vect + 2);
  bx.smallend.vect[0] = (int)uVar6;
  bx.smallend.vect[1] = (int)((ulong)uVar6 >> 0x20);
  bx.smallend.vect[2] = (int)uVar7;
  bx.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
  lVar11 = 0;
  do {
    uVar6 = bx._20_8_;
    if ((bx.btype.itype >> ((uint)lVar11 & 0x1f) & 1) == 0) {
      piVar1 = bx.bigend.vect + lVar11;
      *piVar1 = *piVar1 + 1;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  bx.btype.itype = 7;
  uVar3 = *(ulong *)(ratio->vect + 1);
  iVar8 = (int)uVar3;
  iVar26 = (int)(uVar3 >> 0x20);
  auVar27._0_4_ = -(uint)(iVar8 == 1);
  auVar27._4_4_ = -(uint)(iVar8 == 1);
  auVar27._8_4_ = -(uint)(iVar26 == 1);
  auVar27._12_4_ = -(uint)(iVar26 == 1);
  uVar21 = movmskpd((int)ratio,auVar27);
  bVar20 = (byte)uVar21 ^ 3;
  bVar18 = ratio->vect[0] != 1 | bVar20;
  uVar19 = CONCAT31(SUB83(uVar6,5),bVar18);
  if (((bVar20 >> 1 | bVar18) & 1) != 0) {
    bx.smallend.vect[0] = bx.smallend.vect[0] * ratio->vect[0];
    uVar19 = iVar26 * bx.bigend.vect[2];
    bx.smallend.vect[2] = bx.smallend.vect[2] * iVar26;
    bx.smallend.vect[1] = (int)((uVar3 & 0xffffffff) * (ulong)(uint)bx.smallend.vect[1]);
    bx.btype.itype = bx.bigend.vect[1] * iVar8;
    bx.bigend.vect[2] = uVar19;
  }
  iVar8 = bx.smallend.vect[0];
  vel = (IntVect *)(ulong)uVar19;
  amrex::BATransformer::operator()
            ((Box *)&sync_boxes,&bxs_00->m_bat,
             (((pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_abox).
             super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar26 = extraout_EDX;
  if ((((sync_boxes.m_bat.m_bat_type == iVar8) &&
       (sync_boxes.m_bat.m_op.m_indexType.m_typ.itype == (BATindexType)bx.smallend.vect[1])) &&
      (sync_boxes.m_bat.m_op.m_bndryReg.m_typ.itype == (IndexType)bx.smallend.vect[2])) &&
     ((sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] == bx.bigend.vect[0] &&
      (sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] == bx.bigend.vect[1])))) {
    if ((sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] == bx.bigend.vect[2]) &&
       (sync_boxes.m_bat.m_op.m_bndryReg.m_loshft.vect[0] == 7)) {
      vel = &rhnd.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&rhnd.super_FabArray<amrex::FArrayBox>,0.0,0,
                 rhnd.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,vel);
      iVar26 = extraout_EDX_00;
    }
  }
  scaleVar(this,rho_crse,iVar26,(MultiFab *)vel,c_lev);
  scaleVar(this,rho_fine,extraout_EDX_01,(MultiFab *)vel,level);
  pauVar12 = (undefined1 (*) [16])operator_new(0x50);
  local_348 = pauVar12 + 5;
  pauVar12[4] = (undefined1  [16])0x0;
  pauVar12[3] = (undefined1  [16])0x0;
  pauVar12[2] = (undefined1  [16])0x0;
  pauVar12[1] = (undefined1  [16])0x0;
  *pauVar12 = (undefined1  [16])0x0;
  local_350 = pauVar12;
  local_340 = local_348;
  pauVar13 = (undefined1 (*) [16])operator_new(0x50);
  local_368.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar13 + 5);
  pauVar13[4] = (undefined1  [16])0x0;
  pauVar13[3] = (undefined1  [16])0x0;
  pauVar13[2] = (undefined1  [16])0x0;
  pauVar13[1] = (undefined1  [16])0x0;
  *pauVar13 = (undefined1  [16])0x0;
  local_368.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar13;
  local_368.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_368.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pauVar14 = (undefined1 (*) [16])operator_new(0x50);
  local_380.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar14 + 5);
  pauVar14[4] = (undefined1  [16])0x0;
  pauVar14[3] = (undefined1  [16])0x0;
  pauVar14[2] = (undefined1  [16])0x0;
  pauVar14[1] = (undefined1  [16])0x0;
  *pauVar14 = (undefined1  [16])0x0;
  local_380.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar14;
  local_380.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_380.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pauVar15 = (undefined1 (*) [16])operator_new(0x50);
  local_398.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar15 + 5);
  pauVar15[4] = (undefined1  [16])0x0;
  pauVar15[3] = (undefined1  [16])0x0;
  pauVar15[2] = (undefined1  [16])0x0;
  pauVar15[1] = (undefined1  [16])0x0;
  *pauVar15 = (undefined1  [16])0x0;
  *(MultiFab **)(*pauVar12 + lVar22 * 8) = Vsync;
  *(MultiFab **)(*pauVar12 + lVar23 * 8) = V_corr;
  *(MultiFab **)(*pauVar13 + lVar22 * 8) = rho_crse;
  *(MultiFab **)(*pauVar13 + lVar23 * 8) = rho_fine;
  *(MultiFab **)(*pauVar14 + lVar22 * 8) = cc_rhs_crse;
  *(MultiFab **)(*pauVar14 + lVar23 * 8) = cc_rhs_fine;
  *(MultiFab **)(*pauVar15 + lVar22 * 8) = &rhnd;
  local_398.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar15;
  local_398.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_398.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this_00 = (NavierStokesBase *)
            __dynamic_cast((this->LevelData).
                           super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar22],
                           &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
  NavierStokesBase::average_down(this_00,V_corr,Vsync,0,3);
  NavierStokesBase::average_down
            (this_00,*(MultiFab **)(*pauVar13 + lVar23 * 8),*(MultiFab **)(*pauVar13 + lVar22 * 8),0
             ,((*(MultiFab **)(*pauVar13 + lVar22 * 8))->super_FabArray<amrex::FArrayBox>).
              super_FabArrayBase.n_comp);
  if (crse_iteration != crse_dt_ratio || c_lev < 1) {
    pFVar16 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    iVar8 = amrex::AmrMesh::MaxRefRatio((AmrMesh *)this->parent,c_lev + -1);
    pFVar16 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    sync_boxes.m_bat._0_8_ = 1;
    sync_boxes.m_bat.m_op._4_16_ = (undefined1  [16])0x0;
    sync_boxes.m_bat.m_op._20_16_ = (undefined1  [16])0x0;
    local_3a0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080b918;
    amrex::MultiFab::MultiFab
              ((MultiFab *)pFVar16,bxs,dm,1,iVar8 + -1,(MFInfo *)&sync_boxes,&local_3a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (pFVar16,0.0,0,(pFVar16->super_FabArrayBase).n_comp,
               &(pFVar16->super_FabArrayBase).n_grow);
  }
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&sync_boxes,&phi);
  crse_geom_00 = (Geometry *)&local_350;
  doMLMGNodalProjection
            (this,c_lev,2,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)crse_geom_00,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&sync_boxes,&local_368
             ,&local_380,&local_398,sync_tol,proj_abs_tol,true,(MultiFab *)0x0,(MultiFab *)pFVar16,
             false);
  iVar8 = extraout_EDX_02;
  if (sync_boxes.m_bat._0_8_ != 0) {
    operator_delete((void *)sync_boxes.m_bat._0_8_,
                    sync_boxes.m_bat.m_op._12_8_ - sync_boxes.m_bat._0_8_);
    iVar8 = extraout_EDX_03;
  }
  if (crse_iteration == crse_dt_ratio && c_lev >= 1) {
    pGVar5 = (this->parent->super_AmrCore).super_AmrMesh.geom.
             super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    amrex::BoxArray::BoxArray(&sync_boxes,bxs_00);
    amrex::BoxArray::coarsen(&sync_boxes,ratio);
    crse_geom_00 = pGVar5 + (ulong)(uint)c_lev + 0xffffffffffffffff;
    SyncRegister::CompAdd
              (crsr_sync_reg,(MultiFab *)pFVar16,crse_geom,crse_geom_00,&sync_boxes,
               1.0 / (double)crse_iteration);
    amrex::BoxArray::~BoxArray(&sync_boxes);
    iVar8 = extraout_EDX_04;
  }
  rescaleVar(this,rho_crse,iVar8,(MultiFab *)crse_geom_00,c_lev);
  rescaleVar(this,rho_fine,extraout_EDX_05,(MultiFab *)crse_geom_00,level);
  amrex::MultiFab::Copy
            (phi_fine,phi.
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,1,1);
  amrex::MultiFab::Add
            (pres_crse,
             phi.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar22]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,1,
             (pres_crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  amrex::MultiFab::Add
            (pres_fine,
             phi.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar23]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,0,1,
             (pres_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  amrex::MultiFab::Saxpy(vel_crse,dt_crse,Vsync,0,0,3,1);
  amrex::MultiFab::Saxpy(vel_fine,dt_crse,V_corr,0,0,3,1);
  if (verbose != 0) {
    dVar25 = amrex::ParallelDescriptor::second();
    poVar17 = amrex::OutStream();
    poVar2 = (ostringstream *)(sync_boxes.m_bat.m_op.m_bndryReg.m_crse_ratio.vect + 1);
    sync_boxes.m_bat.m_op.m_indexType.m_typ.itype =
         (BATindexType)(BATindexType)*(undefined4 *)(DAT_00816950 + -0x48);
    sync_boxes.m_bat.m_bat_type = *(BATType *)(DAT_00816950 + -0x30);
    sync_boxes.m_bat.m_op._4_8_ = poVar17;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)
     ((long)&sync_boxes.m_bat.m_op + *(long *)(sync_boxes.m_bat.m_op._12_8_ + -0x18) + 0x14) =
         *(undefined8 *)
          (sync_boxes.m_bat.m_op._4_8_ + 8 + *(long *)(*(long *)sync_boxes.m_bat.m_op._4_8_ + -0x18)
          );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Projection::MLsyncProject(): levels = ",0x26);
    std::ostream::operator<<(poVar2,c_lev);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
    std::ostream::operator<<(poVar2,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", time: ",8);
    std::ostream::_M_insert<double>(dVar25 - dVar24);
    local_3a0._vptr_FabFactory._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,(char *)&local_3a0,1);
    amrex::Print::~Print((Print *)&sync_boxes);
  }
  if (pFVar16 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(pFVar16->super_FabArrayBase)._vptr_FabArrayBase[1])(pFVar16);
  }
  operator_delete(pauVar15,0x50);
  operator_delete(pauVar14,0x50);
  operator_delete(pauVar13,0x50);
  operator_delete(pauVar12,0x50);
  amrex::MultiFab::~MultiFab(&rhnd);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&phi.
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           );
  return;
}

Assistant:

void
Projection::MLsyncProject (int             c_lev,
                           MultiFab&       pres_crse,
                           MultiFab&       vel_crse,
                           MultiFab&       cc_rhs_crse,
                           MultiFab&       pres_fine,
                           MultiFab&       vel_fine,
                           MultiFab&       cc_rhs_fine,
                           MultiFab&       rho_crse,
                           MultiFab&       rho_fine,
                           MultiFab&       Vsync,
                           MultiFab&       V_corr,
                           MultiFab&       phi_fine,
                           SyncRegister*   rhs_sync_reg,
                           SyncRegister*   crsr_sync_reg,
                           Real            dt_crse,
                           IntVect&        ratio,
                           int             crse_iteration,
                           int             crse_dt_ratio,
                           const Geometry& crse_geom)
{
    BL_PROFILE("Projection::MLsyncProject()");

    if (verbose) {
      amrex::Print() << "Projection::MLsyncProject(): levels = " << c_lev << ", " << c_lev+1 << '\n';
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    //
    // Set up memory.
    //
    Vector<std::unique_ptr<MultiFab> > phi(maxlev);

    const BoxArray& Pgrids_crse = pres_crse.boxArray();
    const BoxArray& Pgrids_fine = pres_fine.boxArray();
    const DistributionMapping& Pdmap_crse = pres_crse.DistributionMap();
    const DistributionMapping& Pdmap_fine = pres_fine.DistributionMap();

    phi[c_lev].reset(new MultiFab(Pgrids_crse,Pdmap_crse,1,1,MFInfo(),LevelData[c_lev]->Factory()));
    phi[c_lev]->setVal(0);

    phi[c_lev+1].reset(new MultiFab(Pgrids_fine,Pdmap_fine,1,1,MFInfo(),LevelData[c_lev+1]->Factory()));
    phi[c_lev+1]->setVal(0);

    //
    // Set up crse RHS
    //
    MultiFab rhnd(Pgrids_crse,Pdmap_crse,1,0,MFInfo(),LevelData[c_lev]->Factory());
    rhs_sync_reg->InitRHS(rhnd,crse_geom,*phys_bc);

    Box P_finedomain(amrex::surroundingNodes(crse_geom.Domain()));
    P_finedomain.refine(ratio);
    if (Pgrids_fine[0] == P_finedomain) {
        rhnd.setVal(0);
    }
    //
    // Do necessary scaling
    //
    scaleVar(&rho_crse, 0, &Vsync,   c_lev  );
    scaleVar(&rho_fine, 0, &V_corr, c_lev+1);

    if (crse_geom.IsRZ()) {
       radMultScal(c_lev  ,cc_rhs_crse);
       radMultScal(c_lev+1,cc_rhs_fine);
    }

    Vector<MultiFab*> vel (maxlev, nullptr);
    Vector<MultiFab*> sig (maxlev, nullptr);
    Vector<MultiFab*> rhcc(maxlev, nullptr);
    Vector<MultiFab*> rhnd_vec(maxlev, nullptr);

    vel[c_lev  ] = &Vsync;
    vel[c_lev+1] = &V_corr;
    sig[c_lev  ] = &rho_crse;
    sig[c_lev+1] = &rho_fine;
    rhcc[c_lev  ] = &cc_rhs_crse;
    rhcc[c_lev+1] = &cc_rhs_fine;
    rhnd_vec[c_lev] = &rhnd;

    NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    ns->average_down(*vel[c_lev+1],*vel[c_lev],0,AMREX_SPACEDIM);

    ns->average_down(*sig[c_lev+1],*sig[c_lev],0,sig[c_lev]->nComp());

    MultiFab* sync_resid_crse = 0;
    std::unique_ptr<MultiFab> sync_resid_fine;

    if (c_lev > 0 &&  crse_iteration == crse_dt_ratio)
    {
        int ngrow = parent->MaxRefRatio(c_lev-1) - 1;
        sync_resid_fine.reset(new MultiFab(Pgrids_crse,Pdmap_crse,1,ngrow));
        sync_resid_fine->setVal(0.);
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, 2, vel,
                          amrex::GetVecOfPtrs(phi),
                          sig, rhcc, rhnd_vec, sync_tol, proj_abs_tol, increment_gp,
                          sync_resid_crse, sync_resid_fine.get());

    //
    // If this sync project is not at levels 0-1 then we need to account for
    // the changes made here in the level c_lev velocity in the sync registers
    // going into the level (c_lev-1) sync project.  Note that this must be
    // done before rho_half is scaled back.
    //
    if (c_lev > 0 && crse_iteration == crse_dt_ratio)
    {
        const Real invrat         = 1.0/Real(crse_dt_ratio);
        const Geometry& crsr_geom = parent->Geom(c_lev-1);
        BoxArray sync_boxes       = pres_fine.boxArray();
        sync_boxes.coarsen(ratio);
        crsr_sync_reg->CompAdd(*sync_resid_fine,crse_geom,crsr_geom,sync_boxes,invrat);
    }
    //
    // Do necessary un-scaling.
    //
    rescaleVar(&rho_crse, 0, &Vsync,   c_lev  );
    rescaleVar(&rho_fine, 0, &V_corr, c_lev+1);

    MultiFab::Copy(phi_fine, *phi[c_lev+1], 0, 0, 1, 1);

    //
    // Add phi to pressure.
    // Only update the most recent pressure.
    //
    MultiFab::Add(pres_crse,*phi[c_lev],0,0,1,pres_crse.nGrow());
    MultiFab::Add(pres_fine,*phi[c_lev+1],0,0,1,pres_fine.nGrow());
    //
    // Grad(P_new) incremented in doMLMGNodalProjection
    //

    //
    // Add projected vel to new velocity.
    //
    MultiFab::Saxpy(vel_crse,dt_crse,Vsync,0,0,AMREX_SPACEDIM,1);
    MultiFab::Saxpy(vel_fine,dt_crse,V_corr,0,0,AMREX_SPACEDIM,1);

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::MLsyncProject(): levels = " << c_lev
		       << ", " << c_lev+1 << ", time: " << run_time << '\n';
    }
}